

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::Token>::add_sample
          (TypedTimeSamples<tinyusdz::Token> *this,double t,Token *v)

{
  undefined1 local_50 [8];
  Sample s;
  Token *v_local;
  double t_local;
  TypedTimeSamples<tinyusdz::Token> *this_local;
  
  s._40_8_ = v;
  Sample::Sample((Sample *)local_50);
  local_50 = (undefined1  [8])t;
  Token::operator=((Token *)&s,(Token *)s._40_8_);
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>>
              *)this,(Sample *)local_50);
  this->_dirty = true;
  Sample::~Sample((Sample *)local_50);
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }